

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask22_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x16 | uVar1;
  uVar2 = uVar2 >> 10;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0xc | uVar2;
  uVar1 = uVar1 >> 0x14;
  out[2] = uVar1;
  uVar1 = in[3] << 2 | uVar1;
  out[2] = uVar1;
  uVar2 = in[4];
  out[2] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[3] = uVar2;
  uVar1 = in[5];
  out[3] = uVar1 << 0xe | uVar2;
  uVar1 = uVar1 >> 0x12;
  out[4] = uVar1;
  uVar1 = in[6] << 4 | uVar1;
  out[4] = uVar1;
  uVar2 = in[7];
  out[4] = uVar2 << 0x1a | uVar1;
  uVar2 = uVar2 >> 6;
  out[5] = uVar2;
  uVar1 = in[8];
  out[5] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[6] = uVar1;
  uVar1 = in[9] << 6 | uVar1;
  out[6] = uVar1;
  uVar2 = in[10];
  out[6] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[7] = uVar2;
  uVar1 = in[0xb];
  out[7] = uVar1 << 0x12 | uVar2;
  uVar1 = uVar1 >> 0xe;
  out[8] = uVar1;
  uVar1 = in[0xc] << 8 | uVar1;
  out[8] = uVar1;
  uVar2 = in[0xd];
  out[8] = uVar2 << 0x1e | uVar1;
  uVar2 = uVar2 >> 2;
  out[9] = uVar2;
  uVar1 = in[0xe];
  out[9] = uVar1 << 0x14 | uVar2;
  uVar1 = uVar1 >> 0xc;
  out[10] = uVar1;
  out[10] = in[0xf] << 10 | uVar1;
  return out + 0xb;
}

Assistant:

uint32_t *__fastpackwithoutmask22_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (22 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (22 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (22 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (22 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (22 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (22 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (22 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (22 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (22 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (22 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  ++in;

  return out;
}